

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O0

void __thiscall DummyTest_Empty_Test::~DummyTest_Empty_Test(DummyTest_Empty_Test *this)

{
  void *in_RDI;
  
  ~DummyTest_Empty_Test((DummyTest_Empty_Test *)0x16f0e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DummyTest, Empty) {
    Deque<int> d;
    ASSERT_TRUE(d.empty());
    d.push_back(1);
    ASSERT_FALSE(d.empty());
    d.pop_back();
    ASSERT_TRUE(d.empty());
}